

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::reportError(Parser *this,ParserException *ex)

{
  bool bVar1;
  ostream *poVar2;
  string sStack_68;
  string local_48 [32];
  
  getFilename_abi_cxx11_(&sStack_68,this);
  bVar1 = std::operator==(&sStack_68,"");
  std::__cxx11::string::~string((string *)&sStack_68);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: ");
    (**(code **)(*(long *)&ex->super_ANTLRException + 0x18))(&sStack_68,ex);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in ");
    getFilename_abi_cxx11_(&sStack_68,this);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
    poVar2 = std::operator<<(poVar2,": ");
    (**(code **)(*(long *)&ex->super_ANTLRException + 0x18))(local_48,ex);
    poVar2 = std::operator<<(poVar2,local_48);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::string::~string((string *)&sStack_68);
  return;
}

Assistant:

void Parser::reportError(const ParserException& ex)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << ex.toString() << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << ex.toString() << std::endl;
}